

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O0

void __thiscall QTextDocument::redo(QTextDocument *this,QTextCursor *cursor)

{
  long lVar1;
  int iVar2;
  QTextDocumentPrivate *document;
  QTextCursor *in_RSI;
  QTextCursor *in_RDI;
  long in_FS_OFFSET;
  int pos;
  QTextDocumentPrivate *d;
  bool in_stack_00000077;
  QTextDocumentPrivate *in_stack_00000078;
  undefined4 in_stack_ffffffffffffffd0;
  QTextCursor *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  document = d_func((QTextDocument *)0x7aad3e);
  iVar2 = QTextDocumentPrivate::undoRedo(in_stack_00000078,in_stack_00000077);
  if ((in_RSI != (QTextCursor *)0x0) && (-1 < iVar2)) {
    QTextCursor::QTextCursor(in_RSI,(QTextDocument *)document);
    QTextCursor::operator=((QTextCursor *)CONCAT44(iVar2,in_stack_ffffffffffffffd0),in_RDI);
    QTextCursor::~QTextCursor((QTextCursor *)0x7aad89);
    QTextCursor::setPosition(this_00,(int)((ulong)in_RSI >> 0x20),(MoveMode)in_RSI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextDocument::redo(QTextCursor *cursor)
{
    Q_D(QTextDocument);
    const int pos = d->undoRedo(false);
    if (cursor && pos >= 0) {
        *cursor = QTextCursor(this);
        cursor->setPosition(pos);
    }
}